

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::EndStepConsequentFixed(SscWriterGeneric *this)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  reference ppVar4;
  uint8_t *puVar5;
  size_t sVar6;
  reference ppoVar7;
  long in_RDI;
  pair<const_int,_std::pair<unsigned_long,_unsigned_long>_> *i;
  iterator __end3;
  iterator __begin3;
  RankPosMap *__range3;
  unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffffa8;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *in_stack_ffffffffffffffb0;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_20;
  _Node_iterator_base<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false>
  local_18;
  long local_10;
  
  local_10 = in_RDI + 0x120;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::pair<unsigned_long,_unsigned_long>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>_>
       ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar3 = std::__detail::operator!=(&local_18,&local_20);
    if (!bVar3) break;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
             ::operator*((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                          *)0x1d19ce);
    std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::emplace_back<>
              (in_stack_ffffffffffffffb0);
    puVar5 = Buffer::data((Buffer *)(in_RDI + 0x38),0);
    sVar6 = Buffer::size((Buffer *)(in_RDI + 0x38));
    iVar1 = ppVar4->first;
    uVar2 = *(undefined8 *)(in_RDI + 0x10);
    ppoVar7 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::back
                        (in_stack_ffffffffffffffb0);
    MPI_Isend(puVar5,sVar6 & 0xffffffff,&ompi_mpi_char,iVar1,0,uVar2,ppoVar7);
    std::__detail::
    _Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>::
    operator++((_Node_iterator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_false,_false>
                *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void SscWriterGeneric::EndStepConsequentFixed()
{
    for (const auto &i : m_AllSendingReaderRanks)
    {
        m_MpiRequests.emplace_back();
        MPI_Isend(m_Buffer.data(), static_cast<int>(m_Buffer.size()), MPI_CHAR, i.first, 0,
                  m_StreamComm, &m_MpiRequests.back());
    }
}